

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O2

void __thiscall
duckdb::WindowDistinctAggregator::Finalize
          (WindowDistinctAggregator *this,WindowAggregatorState *gsink,WindowAggregatorState *lstate
          ,CollectionPtr collection,FrameStats *stats)

{
  Allocator *pAVar1;
  bool bVar2;
  
  (*lstate->_vptr_WindowAggregatorState[2])(lstate,gsink,collection.ptr);
  while (*(char *)&gsink[7].allocator.head.
                   super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>.
                   _M_t.
                   super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>
                   .super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl != '\x05') {
    bVar2 = WindowDistinctAggregatorGlobalState::TryPrepareNextStage
                      ((WindowDistinctAggregatorGlobalState *)gsink,
                       (WindowDistinctAggregatorLocalState *)lstate);
    if (bVar2) {
      WindowDistinctAggregatorLocalState::ExecuteTask((WindowDistinctAggregatorLocalState *)lstate);
    }
    else {
      sched_yield();
    }
  }
  MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
  ::Build((MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
           *)&gsink[9].allocator.head);
  WindowDistinctSortTree::Build
            ((WindowDistinctSortTree *)&gsink[10].allocator.arena_allocator.reallocate_function,
             (WindowDistinctAggregatorLocalState *)lstate);
  LOCK();
  pAVar1 = &gsink[6].allocator.arena_allocator;
  pAVar1->allocate_function = pAVar1->allocate_function + 1;
  UNLOCK();
  return;
}

Assistant:

void WindowDistinctAggregator::Finalize(WindowAggregatorState &gsink, WindowAggregatorState &lstate,
                                        CollectionPtr collection, const FrameStats &stats) {
	auto &gdsink = gsink.Cast<WindowDistinctAggregatorGlobalState>();
	auto &ldstate = lstate.Cast<WindowDistinctAggregatorLocalState>();
	ldstate.Finalize(gdsink, collection);

	// Sort, merge and build the tree in parallel
	while (gdsink.stage.load() != PartitionSortStage::FINISHED) {
		if (gdsink.TryPrepareNextStage(ldstate)) {
			ldstate.ExecuteTask();
		} else {
			std::this_thread::yield();
		}
	}

	//	These are a parallel implementations,
	//	so every thread can call them.
	gdsink.zipped_tree.Build();
	gdsink.merge_sort_tree.Build(ldstate);

	++gdsink.finalized;
}